

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

uint32_t mjs::to_uint32(double n)

{
  uint32_t uVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = ABS(n);
  uVar1 = 0;
  if (dVar2 != INFINITY && (dVar2 != 0.0 && (ulong)dVar2 < 0x7ff0000000000000)) {
    dVar2 = floor(ABS(n));
    dVar3 = (double)(-(ulong)(n < 0.0) & (ulong)-dVar2 | ~-(ulong)(n < 0.0) & (ulong)dVar2);
    dVar2 = floor(dVar3 * 2.3283064365386963e-10);
    dVar3 = dVar2 * -4294967296.0 + dVar3;
    if ((dVar3 < 0.0) || (4294967296.0 <= dVar3)) {
      __assert_fail("n >= 0.0 && n < max",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                    ,200,"uint32_t mjs::to_uint32(double)");
    }
    uVar1 = (uint32_t)(long)dVar3;
  }
  return uVar1;
}

Assistant:

uint32_t to_uint32(double n) {
    if (std::isnan(n) || n == 0 || std::isinf(n)) {
        return 0;
    }
    n = to_integer_inner(n);
    constexpr double max = 1ULL << 32;
    n = n - max * std::floor(n / max);
    assert(n >= 0.0 && n < max);
    return static_cast<uint32_t>(n);
}